

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_relative_path(void)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uv_loop_t *puVar4;
  undefined8 uVar5;
  char *__format;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int64_t eval_b;
  int64_t eval_a;
  
  init_process_options("spawn_helper1",exit_cb);
  exepath_size = 0x3fe;
  iVar1 = uv_exepath(exepath,&exepath_size);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    exepath[exepath_size] = '\0';
    pcVar2 = strrchr(exepath,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strrchr(exepath,0x5c);
      if (pcVar2 == (char *)0x0) {
        pcVar6 = "!=";
        eval_b = 0;
        pcVar8 = "!=";
        eval_a = 0;
        pcVar7 = "NULL";
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
        pcVar2 = "sep";
        uVar5 = 0x89c;
        goto LAB_0017a7c8;
      }
    }
    sVar3 = strlen(pcVar2);
    memmove(pcVar2 + 2,pcVar2,sVar3 + 1);
    pcVar2[0] = '\0';
    pcVar2[1] = '.';
    pcVar2[2] = '/';
    options.file = pcVar2 + 1;
    options.cwd = exepath;
    *options.args = options.file;
    puVar4 = uv_default_loop();
    iVar1 = uv_spawn(puVar4,&process,&options);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      puVar4 = uv_default_loop();
      iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        eval_a = 1;
        eval_b = (int64_t)exit_cb_called;
        if (eval_b == 1) {
          eval_a = 1;
          eval_b = (int64_t)close_cb_called;
          if (eval_b == 1) {
            puVar4 = uv_default_loop();
            close_loop(puVar4);
            eval_a = 0;
            puVar4 = uv_default_loop();
            iVar1 = uv_loop_close(puVar4);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar7 = "uv_loop_close(uv_default_loop())";
            pcVar2 = "0";
            uVar5 = 0x8ad;
          }
          else {
            pcVar7 = "close_cb_called";
            pcVar2 = "1";
            uVar5 = 0x8ab;
          }
        }
        else {
          pcVar7 = "exit_cb_called";
          pcVar2 = "1";
          uVar5 = 0x8aa;
        }
      }
      else {
        pcVar7 = "0";
        pcVar2 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar5 = 0x8a8;
      }
    }
    else {
      pcVar7 = "0";
      pcVar2 = "uv_spawn(uv_default_loop(), &process, &options)";
      uVar5 = 0x8a7;
    }
  }
  else {
    pcVar7 = "0";
    pcVar2 = "uv_exepath(exepath, &exepath_size)";
    uVar5 = 0x895;
  }
  pcVar6 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar8 = "==";
LAB_0017a7c8:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar5,pcVar2,pcVar6,pcVar7,eval_a,pcVar8,eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_relative_path) {
  char* sep;

  init_process_options("spawn_helper1", exit_cb);

  exepath_size = sizeof(exepath) - 2;
  ASSERT_OK(uv_exepath(exepath, &exepath_size));
  exepath[exepath_size] = '\0';

  /* Poor man's basename(3). */
  sep = strrchr(exepath, '/');
  if (sep == NULL)
    sep = strrchr(exepath, '\\');
  ASSERT_NOT_NULL(sep);

  /* Split into dirname and basename and make basename relative. */
  memmove(sep + 2, sep, 1 + strlen(sep));
  sep[0] = '\0';
  sep[1] = '.';
  sep[2] = '/';

  options.cwd = exepath;
  options.file = options.args[0] = sep + 1;

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}